

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadMaterialVertexInputBinding(ColladaParser *this,SemanticMappingTable *tbl)

{
  mapped_type mVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar5;
  Logger *this_00;
  undefined4 extraout_var_01;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string s;
  uint uStack_20;
  int n;
  InputSemanticMapEntry vn;
  SemanticMappingTable *tbl_local;
  ColladaParser *this_local;
  
  vn = (InputSemanticMapEntry)tbl;
  do {
    do {
      while( true ) {
        uVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar3 & 1) == 0) {
          return;
        }
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar4 != 1) break;
        bVar2 = IsElement(this,"bind_vertex_input");
        if (bVar2) {
          Collada::InputSemanticMapEntry::InputSemanticMapEntry
                    ((InputSemanticMapEntry *)&stack0xffffffffffffffe0);
          s.field_2._12_4_ = GetAttribute(this,"semantic");
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])
                            (this->mReader,(ulong)(uint)s.field_2._12_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_48,(char *)CONCAT44(extraout_var,iVar4),&local_49);
          std::allocator<char>::~allocator(&local_49);
          s.field_2._12_4_ = GetAttribute(this,"input_semantic");
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])
                            (this->mReader,(ulong)(uint)s.field_2._12_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,(char *)CONCAT44(extraout_var_00,iVar4),&local_81);
          n = GetTypeForSemantic(this,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::allocator<char>::~allocator(&local_81);
          s.field_2._12_4_ = TestAttribute(this,"input_set");
          if (s.field_2._12_4_ != 0xffffffff) {
            uStack_20 = (*this->mReader->_vptr_IIrrXMLReader[10])
                                  (this->mReader,(ulong)(uint)s.field_2._12_4_);
          }
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
                                 *)((long)vn + 0x20),(key_type *)local_48);
          mVar1.mType = n;
          mVar1.mSet = uStack_20;
          *pmVar5 = mVar1;
          std::__cxx11::string::~string((string *)local_48);
        }
        else {
          bVar2 = IsElement(this,"bind");
          if (bVar2) {
            this_00 = DefaultLogger::get();
            Logger::warn(this_00,"Collada: Found unsupported <bind> element");
          }
        }
      }
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar4 != 2);
    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"instance_material");
  } while (iVar4 != 0);
  return;
}

Assistant:

void ColladaParser::ReadMaterialVertexInputBinding(Collada::SemanticMappingTable& tbl)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("bind_vertex_input"))
            {
                Collada::InputSemanticMapEntry vn;

                // effect semantic
                int n = GetAttribute("semantic");
                std::string s = mReader->getAttributeValue(n);

                // input semantic
                n = GetAttribute("input_semantic");
                vn.mType = GetTypeForSemantic(mReader->getAttributeValue(n));

                // index of input set
                n = TestAttribute("input_set");
                if (-1 != n)
                    vn.mSet = mReader->getAttributeValueAsInt(n);

                tbl.mMap[s] = vn;
            }
            else if (IsElement("bind")) {
                ASSIMP_LOG_WARN("Collada: Found unsupported <bind> element");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "instance_material") == 0)
                break;
        }
    }
}